

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O1

dota_record * accumulate(dota_record *target,dota_record *source)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  iVar1 = target->played + source->played;
  target->played = iVar1;
  iVar2 = target->win + source->win;
  target->win = iVar2;
  fVar3 = 0.0;
  if (iVar1 != 0) {
    fVar3 = ((float)iVar2 * 100.0) / (float)iVar1;
  }
  target->rate = fVar3;
  return target;
}

Assistant:

dota_record & accumulate(dota_record & target, const dota_record & source) {
    //  first param is not const, so we can modify it.
    target.played += source.played;
    target.win += source.win;
    update_record(target);
    return target;
}